

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrFreeNtk(Vec_Ptr_t *vNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Vec_t *pVVar3;
  Vec_Flt_t *pVVar4;
  Vec_Ptr_t *vNtk_local;
  
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Vec_PtrFree(pVVar2);
  pVVar2 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Vec_PtrFree(pVVar2);
  pVVar3 = (Vec_Vec_t *)Vec_PtrEntry(vNtk,3);
  Vec_VecFree(pVVar3);
  pVVar3 = (Vec_Vec_t *)Vec_PtrEntry(vNtk,4);
  Vec_VecFree(pVVar3);
  iVar1 = Vec_PtrSize(vNtk);
  if (5 < iVar1) {
    pVVar4 = (Vec_Flt_t *)Vec_PtrEntry(vNtk,5);
    Vec_FltFree(pVVar4);
  }
  iVar1 = Vec_PtrSize(vNtk);
  if (6 < iVar1) {
    pVVar4 = (Vec_Flt_t *)Vec_PtrEntry(vNtk,6);
    Vec_FltFree(pVVar4);
  }
  Vec_PtrFree(vNtk);
  return;
}

Assistant:

void Bac_PtrFreeNtk( Vec_Ptr_t * vNtk )
{
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 3) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 4) );
    if ( Vec_PtrSize(vNtk) > 5 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 5) );
    if ( Vec_PtrSize(vNtk) > 6 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 6) );
    Vec_PtrFree( vNtk );
}